

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sign0.c
# Opt level: O1

_Bool CreateSign0AAD(COSE_Sign0Message *pMessage,byte **ppbToSign,size_t *pcbToSign,char *szContext,
                    cose_errback *perr)

{
  _Bool _Var1;
  cose_error cVar2;
  cn_cbor_errback in_RAX;
  cn_cbor *cb_array;
  cn_cbor *pcVar3;
  size_t __nmemb;
  uint8_t *puVar4;
  size_t sVar5;
  int len;
  cn_cbor_errback cbor_error;
  cn_cbor_errback local_38;
  
  local_38 = in_RAX;
  cb_array = cn_cbor_array_create(&local_38);
  if ((cb_array == (cn_cbor *)0x0) ||
     (pcVar3 = cn_cbor_string_create("Signature1",&local_38), pcVar3 == (cn_cbor *)0x0))
  goto LAB_001fe852;
  _Var1 = cn_cbor_array_append(cb_array,pcVar3,&local_38);
  if (!_Var1) goto LAB_001fe861;
  pcVar3 = _COSE_arrayget_int(&pMessage->m_message,0);
  if (pcVar3 == (cn_cbor *)0x0) {
    cVar2 = COSE_ERR_INVALID_PARAMETER;
    goto LAB_001fe8b7;
  }
  len = pcVar3->length;
  if ((len == 1) && (*(pcVar3->v).bytes == 0xa0)) {
    puVar4 = (uint8_t *)0x0;
    len = 0;
  }
  else {
    puVar4 = (pcVar3->v).bytes;
  }
  pcVar3 = cn_cbor_data_create(puVar4,len,&local_38);
  if (pcVar3 == (cn_cbor *)0x0) {
LAB_001fe852:
    pcVar3 = (cn_cbor *)0x0;
    puVar4 = (uint8_t *)0x0;
    if (szContext != (char *)0x0) {
LAB_001fe866:
      cVar2 = _MapFromCBOR(local_38);
      puVar4 = (uint8_t *)0x0;
      goto LAB_001fe871;
    }
  }
  else {
    _Var1 = cn_cbor_array_append(cb_array,pcVar3,&local_38);
    if (!_Var1) {
LAB_001fe861:
      if (szContext != (char *)0x0) goto LAB_001fe866;
      puVar4 = (uint8_t *)0x0;
      goto LAB_001fe874;
    }
    pcVar3 = cn_cbor_data_create((pMessage->m_message).m_pbExternal,
                                 (int)(pMessage->m_message).m_cbExternal,&local_38);
    if (pcVar3 == (cn_cbor *)0x0) goto LAB_001fe852;
    _Var1 = cn_cbor_array_append(cb_array,pcVar3,&local_38);
    if (!_Var1) goto LAB_001fe861;
    pcVar3 = _COSE_arrayget_int(&pMessage->m_message,2);
    pcVar3 = cn_cbor_data_create((pcVar3->v).bytes,pcVar3->length,&local_38);
    if (pcVar3 == (cn_cbor *)0x0) goto LAB_001fe852;
    _Var1 = cn_cbor_array_append(cb_array,pcVar3,&local_38);
    if (!_Var1) goto LAB_001fe861;
    __nmemb = cn_cbor_encode_size(cb_array);
    if (__nmemb == 0) {
      cVar2 = COSE_ERR_CBOR;
LAB_001fe8b7:
      puVar4 = (uint8_t *)0x0;
    }
    else {
      puVar4 = (uint8_t *)calloc(__nmemb,1);
      if (puVar4 == (uint8_t *)0x0) {
        cVar2 = COSE_ERR_OUT_OF_MEMORY;
        goto LAB_001fe8b7;
      }
      sVar5 = cn_cbor_encoder_write(puVar4,0,__nmemb,cb_array);
      if (-1 < (long)sVar5 && sVar5 == __nmemb) {
        *ppbToSign = puVar4;
        *pcbToSign = __nmemb;
        _Var1 = true;
        goto LAB_001fe895;
      }
      cVar2 = COSE_ERR_CBOR;
    }
    pcVar3 = (cn_cbor *)0x0;
    if (szContext != (char *)0x0) {
LAB_001fe871:
      *(cose_error *)szContext = cVar2;
    }
  }
LAB_001fe874:
  if (puVar4 != (uint8_t *)0x0) {
    free(puVar4);
  }
  if (pcVar3 != (cn_cbor *)0x0) {
    cn_cbor_free(pcVar3);
  }
  _Var1 = false;
  if (cb_array == (cn_cbor *)0x0) {
    return false;
  }
LAB_001fe895:
  free(cb_array);
  return _Var1;
}

Assistant:

static bool CreateSign0AAD(COSE_Sign0Message * pMessage, byte ** ppbToSign, size_t * pcbToSign, char * szContext, cose_errback * perr)
{
	cn_cbor * pArray = NULL;
#ifdef USE_CBOR_CONTEXT
	cn_cbor_context * context = &pMessage->m_message.m_allocContext;
#endif
	cn_cbor_errback cbor_error;
	cn_cbor * cn = NULL;
	cn_cbor * cn2;
	size_t cbToSign;
	ssize_t written;
	byte * pbToSign = NULL;

	pArray = cn_cbor_array_create(CBOR_CONTEXT_PARAM_COMMA &cbor_error);
	CHECK_CONDITION_CBOR(pArray != NULL, cbor_error);

	cn = cn_cbor_string_create(szContext, CBOR_CONTEXT_PARAM_COMMA &cbor_error);
	CHECK_CONDITION_CBOR(cn != NULL, cbor_error);
	CHECK_CONDITION_CBOR(cn_cbor_array_append(pArray, cn, &cbor_error), cbor_error);
	cn = NULL;

	cn2 = _COSE_arrayget_int(&pMessage->m_message, INDEX_PROTECTED);
	CHECK_CONDITION(cn2 != NULL, COSE_ERR_INVALID_PARAMETER);

	if ((cn2->length == 1) && (cn2->v.bytes[0] == 0xa0)) cn = cn_cbor_data_create(NULL, 0, CBOR_CONTEXT_PARAM_COMMA &cbor_error);
	else cn = cn_cbor_data_create(cn2->v.bytes, (int)cn2->length, CBOR_CONTEXT_PARAM_COMMA &cbor_error);
	CHECK_CONDITION_CBOR(cn != NULL, cbor_error);
	CHECK_CONDITION_CBOR(cn_cbor_array_append(pArray, cn, &cbor_error), cbor_error);
	cn = NULL;

	cn = cn_cbor_data_create(pMessage->m_message.m_pbExternal, (int) pMessage->m_message.m_cbExternal, CBOR_CONTEXT_PARAM_COMMA &cbor_error);
	CHECK_CONDITION_CBOR(cn != NULL, cbor_error);
	CHECK_CONDITION_CBOR(cn_cbor_array_append(pArray, cn, &cbor_error), cbor_error);
	cn = NULL;

	cn2 = _COSE_arrayget_int(&pMessage->m_message, INDEX_BODY);
	cn = cn_cbor_data_create(cn2->v.bytes, (int)cn2->length, CBOR_CONTEXT_PARAM_COMMA &cbor_error);
	CHECK_CONDITION_CBOR(cn != NULL, cbor_error);
	CHECK_CONDITION_CBOR(cn_cbor_array_append(pArray, cn, &cbor_error), cbor_error);
	cn = NULL;


	cbToSign = cn_cbor_encode_size(pArray);
	CHECK_CONDITION(cbToSign > 0, COSE_ERR_CBOR);
	pbToSign = (byte *)COSE_CALLOC(cbToSign, 1, context);
	CHECK_CONDITION(pbToSign != NULL, COSE_ERR_OUT_OF_MEMORY);
	written = cn_cbor_encoder_write(pbToSign, 0, cbToSign, pArray);
	CHECK_CONDITION(written >= 0 && (size_t)written == cbToSign, COSE_ERR_CBOR);

	*ppbToSign = pbToSign;
	*pcbToSign = cbToSign;
	pbToSign = NULL;

	if (cn != NULL) CN_CBOR_FREE(cn, context);
	if (pArray != NULL) COSE_FREE(pArray, context);
	return true;

errorReturn:
	if (pbToSign != NULL) COSE_FREE(pbToSign, context);
	if (cn != NULL) CN_CBOR_FREE(cn, context);
	if (pArray != NULL) COSE_FREE(pArray, context);
	return false;
}